

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O1

void __thiscall arangodb::velocypack::Parser::scanDigits(Parser *this,ParsedNumber *value)

{
  ulong uVar1;
  uint i;
  
  while( true ) {
    uVar1 = this->_pos;
    i = 0xffffffff;
    if (uVar1 < this->_size) {
      this->_pos = uVar1 + 1;
      i = (uint)this->_start[uVar1];
    }
    if ((int)i < 0) break;
    if (i - 0x3a < 0xfffffff6) {
      this->_pos = this->_pos - 1;
      return;
    }
    ParsedNumber::addDigit(value,i);
  }
  return;
}

Assistant:

void scanDigits(ParsedNumber& value) {
    while (true) {
      int i = consume();
      if (i < 0) {
        return;
      }
      if (i < '0' || i > '9') {
        unconsume();
        return;
      }
      value.addDigit(i);
    }
  }